

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringExplicitLodTests.cpp
# Opt level: O0

void __thiscall
vkt::texture::anon_unknown_3::Texture2DGradientTestCase::Texture2DGradientTestCase
          (Texture2DGradientTestCase *this,TestContext *testCtx,char *name,char *desc,
          TextureFormat format,IVec3 *dimensions,VkFilter magFilter,VkFilter minFilter,
          VkSamplerMipmapMode mipmapFilter,VkSamplerAddressMode wrappingMode,bool useDerivatives)

{
  TestCaseData local_c0;
  byte local_39;
  IVec3 *pIStack_38;
  bool useDerivatives_local;
  IVec3 *dimensions_local;
  char *desc_local;
  char *name_local;
  TestContext *testCtx_local;
  Texture2DGradientTestCase *this_local;
  TextureFormat format_local;
  
  local_39 = useDerivatives;
  pIStack_38 = dimensions;
  dimensions_local = (IVec3 *)desc;
  desc_local = name;
  name_local = (char *)testCtx;
  testCtx_local = (TestContext *)this;
  this_local = (Texture2DGradientTestCase *)format;
  TextureFilteringTestCase::TextureFilteringTestCase
            (&this->super_TextureFilteringTestCase,testCtx,name,desc);
  (this->super_TextureFilteringTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__Texture2DGradientTestCase_016b3f08;
  this->m_format = (TextureFormat)this_local;
  tcu::Vector<int,_3>::Vector(&this->m_dimensions,dimensions);
  this->m_magFilter = magFilter;
  this->m_minFilter = minFilter;
  this->m_mipmapFilter = mipmapFilter;
  this->m_wrappingMode = wrappingMode;
  this->m_useDerivatives = (bool)(local_39 & 1);
  genTestCaseData(&local_c0,this);
  TestCaseData::operator=(&(this->super_TextureFilteringTestCase).m_testCaseData,&local_c0);
  TestCaseData::~TestCaseData(&local_c0);
  TextureFilteringTestCase::initSpec(&this->super_TextureFilteringTestCase);
  return;
}

Assistant:

Texture2DGradientTestCase (TestContext&			testCtx,
							   const char*			name,
							   const char*			desc,
							   TextureFormat		format,
							   IVec3				dimensions,
							   VkFilter				magFilter,
							   VkFilter				minFilter,
							   VkSamplerMipmapMode	mipmapFilter,
							   VkSamplerAddressMode	wrappingMode,
							   bool					useDerivatives)

		: TextureFilteringTestCase	(testCtx, name, desc)
		, m_format					(format)
		, m_dimensions				(dimensions)
		, m_magFilter				(magFilter)
		, m_minFilter				(minFilter)
		, m_mipmapFilter			(mipmapFilter)
		, m_wrappingMode			(wrappingMode)
		, m_useDerivatives			(useDerivatives)
	{
		m_testCaseData = genTestCaseData();
		initSpec();
	}